

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O0

void pstore::exchange::export_ns::emit_compilation
               (ostream_base *os,indent ind,database *db,compilation *compilation,
               string_mapping *strings,bool comments)

{
  indent ind_00;
  string_mapping *this;
  ostream_base *poVar1;
  typed_address<pstore::indirect_string> tVar2;
  char *v;
  const_iterator first;
  const_iterator last;
  int __c;
  indent local_38;
  byte local_31;
  indent object_indent;
  bool comments_local;
  string_mapping *strings_local;
  compilation *compilation_local;
  database *db_local;
  ostream_base *os_local;
  indent ind_local;
  
  local_31 = comments;
  _object_indent = strings;
  os_local._4_4_ = ind.distance_;
  operator<<(os,"{\n");
  local_38 = indent::next((indent *)((long)&os_local + 4));
  poVar1 = operator<<(os,&local_38);
  poVar1 = operator<<(poVar1,"\"triple\":");
  this = _object_indent;
  tVar2 = repo::compilation::triple(compilation);
  v = string_mapping::index(this,(char *)tVar2.a_.a_,__c);
  poVar1 = operator<<(poVar1,(unsigned_long)v);
  operator<<(poVar1,',');
  tVar2 = repo::compilation::triple(compilation);
  show_string(os,db,tVar2,(bool)(local_31 & 1));
  poVar1 = operator<<(os,'\n');
  poVar1 = operator<<(poVar1,&local_38);
  operator<<(poVar1,"\"definitions\":");
  ind_00.distance_ = local_38.distance_;
  first = repo::compilation::begin(compilation);
  last = repo::compilation::end(compilation);
  emit_array_with_name<pstore::exchange::export_ns::ostream_base,pstore::repo::definition_const*,pstore::exchange::export_ns::emit_compilation(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,pstore::repo::compilation_const&,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>
            (os,ind_00,db,first,last,(bool)(local_31 & 1),_object_indent);
  poVar1 = operator<<(os,'\n');
  poVar1 = operator<<(poVar1,(indent *)((long)&os_local + 4));
  operator<<(poVar1,'}');
  return;
}

Assistant:

void emit_compilation (ostream_base & os, indent const ind, database const & db,
                                   repo::compilation const & compilation,
                                   string_mapping const & strings, bool const comments) {
                os << "{\n";
                auto const object_indent = ind.next ();
                os << object_indent << R"("triple":)" << strings.index (compilation.triple ())
                   << ',';
                show_string (os, db, compilation.triple (), comments);
                os << '\n' << object_indent << R"("definitions":)";
                emit_array_with_name (os, object_indent, db, compilation.begin (),
                                      compilation.end (), comments,
                                      [&] (ostream_base & os1, repo::definition const & d) {
                                          os1 << R"({"digest":)";
                                          emit_digest (os1, d.digest);
                                          os1 << R"(,"name":)" << strings.index (d.name)
                                              << R"(,"linkage":")" << d.linkage () << '"';
                                          if (d.visibility () != repo::visibility::default_vis) {
                                              os1 << R"(,"visibility":")" << d.visibility () << '"';
                                          }
                                          os1 << '}';
                                          return d.name;
                                      });
                os << '\n' << ind << '}';
            }